

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateAttributeValueInternal(xmlDocPtr doc,xmlAttributeType type,xmlChar *value)

{
  int iVar1;
  
  switch(type) {
  case XML_ATTRIBUTE_ID:
  case XML_ATTRIBUTE_IDREF:
  case XML_ATTRIBUTE_ENTITY:
  case XML_ATTRIBUTE_NOTATION:
    iVar1 = xmlValidateNameValueInternal(doc,value);
    return iVar1;
  case XML_ATTRIBUTE_IDREFS:
  case XML_ATTRIBUTE_ENTITIES:
    iVar1 = xmlValidateNamesValueInternal(doc,value);
    return iVar1;
  case XML_ATTRIBUTE_NMTOKEN:
    iVar1 = xmlValidateNmtokenValueInternal(doc,value);
    return iVar1;
  case XML_ATTRIBUTE_NMTOKENS:
  case XML_ATTRIBUTE_ENUMERATION:
    iVar1 = xmlValidateNmtokensValueInternal(doc,value);
    return iVar1;
  default:
    return 1;
  }
}

Assistant:

static int
xmlValidateAttributeValueInternal(xmlDocPtr doc, xmlAttributeType type,
                                  const xmlChar *value) {
    switch (type) {
	case XML_ATTRIBUTE_ENTITIES:
	case XML_ATTRIBUTE_IDREFS:
	    return(xmlValidateNamesValueInternal(doc, value));
	case XML_ATTRIBUTE_ENTITY:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NOTATION:
	    return(xmlValidateNameValueInternal(doc, value));
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	    return(xmlValidateNmtokensValueInternal(doc, value));
	case XML_ATTRIBUTE_NMTOKEN:
	    return(xmlValidateNmtokenValueInternal(doc, value));
        case XML_ATTRIBUTE_CDATA:
	    break;
    }
    return(1);
}